

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  StringPtr *params;
  CappedArray<char,_14UL> local_48;
  ArrayPtr<const_char> local_30;
  long local_20;
  DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = (ArrayPtr<const_char>)tryToCharSequence(param_2);
  params = (StringPtr *)(local_20 + 8);
  tryToCharSequence<unsigned_int,kj::CappedArray<char,14ul>>
            (&local_48,(_ *)(local_20 + 4),(uint *)local_30.size_);
  concat<kj::StringPtr,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_48,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}